

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O2

EraseResult __thiscall
absl::status_internal::StatusRep::ErasePayload(StatusRep *this,string_view type_url)

{
  StatusCode SVar1;
  InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>
  *pIVar2;
  undefined8 extraout_RAX;
  undefined8 uVar3;
  char *in_RCX;
  Pointer<std::allocator<absl::status_internal::Payload>_> pPVar4;
  optional<unsigned_long> oVar5;
  EraseResult EVar6;
  string_view type_url_00;
  
  type_url_00._M_len = type_url._M_str;
  type_url_00._M_str = in_RCX;
  oVar5 = FindPayloadIndexByUrl
                    ((status_internal *)
                     (this->payloads_)._M_t.
                     super___uniq_ptr_impl<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_*,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
                     .
                     super__Head_base<0UL,_absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_*,_false>
                     ._M_head_impl,(Payloads *)type_url._M_len,type_url_00);
  if (((undefined1  [16])
       oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    uVar3 = 0;
  }
  else {
    pIVar2 = (this->payloads_)._M_t.
             super___uniq_ptr_impl<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_*,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
             .
             super__Head_base<0UL,_absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_*,_false>
             ._M_head_impl;
    if ((*(byte *)&(pIVar2->storage_).metadata_ & 1) == 0) {
      pPVar4 = (Pointer<std::allocator<absl::status_internal::Payload>_>)&(pIVar2->storage_).data_;
    }
    else {
      pPVar4 = (pIVar2->storage_).data_.allocated.allocated_data;
    }
    InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>
    ::erase(pIVar2,pPVar4 + oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                            super__Optional_payload_base<unsigned_long>._M_payload);
    pIVar2 = (this->payloads_)._M_t.
             super___uniq_ptr_impl<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_*,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
             .
             super__Head_base<0UL,_absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_*,_false>
             ._M_head_impl;
    if ((*(ulong *)&(pIVar2->storage_).metadata_ < 2) && ((this->message_)._M_string_length == 0)) {
      SVar1 = this->code_;
      Unref(this);
      uVar3 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      this = (StatusRep *)((long)(int)SVar1 * 4 + 1);
    }
    else {
      uVar3 = CONCAT71((int7)((ulong)pIVar2 >> 8),1);
    }
  }
  EVar6.new_rep = (uintptr_t)this;
  EVar6._0_8_ = uVar3;
  return EVar6;
}

Assistant:

StatusRep::EraseResult StatusRep::ErasePayload(absl::string_view type_url) {
  absl::optional<size_t> index =
      status_internal::FindPayloadIndexByUrl(payloads_.get(), type_url);
  if (!index.has_value()) return {false, Status::PointerToRep(this)};
  payloads_->erase(payloads_->begin() + index.value());
  if (payloads_->empty() && message_.empty()) {
    // Special case: If this can be represented inlined, it MUST be inlined
    // (== depends on this behavior).
    EraseResult result = {true, Status::CodeToInlinedRep(code_)};
    Unref();
    return result;
  }
  return {true, Status::PointerToRep(this)};
}